

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

bool __thiscall CNetAddr::SetSpecial(CNetAddr *this,string *addr)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (addr->_M_string_length != 0) {
    sVar4 = 0;
    do {
      if ((addr->_M_dataplus)._M_p[sVar4] == '\0') {
        bVar3 = false;
        goto LAB_006bf195;
      }
      sVar4 = sVar4 + 1;
    } while (addr->_M_string_length != sVar4);
  }
  bVar2 = SetTor(this,addr);
  bVar3 = true;
  if (bVar2) {
LAB_006bf195:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return bVar3;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    bVar3 = SetI2P(this,addr);
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::SetSpecial(const std::string& addr)
{
    if (!ContainsNoNUL(addr)) {
        return false;
    }

    if (SetTor(addr)) {
        return true;
    }

    if (SetI2P(addr)) {
        return true;
    }

    return false;
}